

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgpsec_utils.c
# Opt level: O2

int validate_signature(uchar *hash,rtr_signature_seg *sig,spki_record *record)

{
  long lVar1;
  int iVar2;
  int iVar3;
  EC_KEY *key;
  long in_FS_OFFSET;
  EC_KEY *pub_key;
  char ski_str [61];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pub_key = (EC_KEY *)0x0;
  iVar2 = load_public_key(&pub_key,record->spki);
  key = pub_key;
  if (iVar2 == 0) {
    iVar2 = 0;
    iVar3 = ECDSA_verify(0,hash,0x20,sig->signature,(uint)sig->sig_len,(EC_KEY *)pub_key);
    if (iVar3 == 1) {
      lrtr_dbg("BGPSEC: Validation result of signature: valid");
      iVar2 = 1;
    }
    else if (iVar3 == 0) {
      lrtr_dbg("BGPSEC: Validation result of signature: invalid");
      iVar2 = 2;
    }
    else if (iVar3 == -1) {
      lrtr_dbg("BGPSEC: ERROR: Failed to verify EC Signature");
      iVar2 = -1;
    }
  }
  else {
    ski_str[0x30] = '\0';
    ski_str[0x31] = '\0';
    ski_str[0x32] = '\0';
    ski_str[0x33] = '\0';
    ski_str[0x34] = '\0';
    ski_str[0x35] = '\0';
    ski_str[0x36] = '\0';
    ski_str[0x37] = '\0';
    ski_str[0x38] = '\0';
    ski_str[0x39] = '\0';
    ski_str[0x3a] = '\0';
    ski_str[0x3b] = '\0';
    ski_str[0x3c] = '\0';
    ski_str[0x20] = '\0';
    ski_str[0x21] = '\0';
    ski_str[0x22] = '\0';
    ski_str[0x23] = '\0';
    ski_str[0x24] = '\0';
    ski_str[0x25] = '\0';
    ski_str[0x26] = '\0';
    ski_str[0x27] = '\0';
    ski_str[0x28] = '\0';
    ski_str[0x29] = '\0';
    ski_str[0x2a] = '\0';
    ski_str[0x2b] = '\0';
    ski_str[0x2c] = '\0';
    ski_str[0x2d] = '\0';
    ski_str[0x2e] = '\0';
    ski_str[0x2f] = '\0';
    ski_str[0x10] = '\0';
    ski_str[0x11] = '\0';
    ski_str[0x12] = '\0';
    ski_str[0x13] = '\0';
    ski_str[0x14] = '\0';
    ski_str[0x15] = '\0';
    ski_str[0x16] = '\0';
    ski_str[0x17] = '\0';
    ski_str[0x18] = '\0';
    ski_str[0x19] = '\0';
    ski_str[0x1a] = '\0';
    ski_str[0x1b] = '\0';
    ski_str[0x1c] = '\0';
    ski_str[0x1d] = '\0';
    ski_str[0x1e] = '\0';
    ski_str[0x1f] = '\0';
    ski_str[0] = '\0';
    ski_str[1] = '\0';
    ski_str[2] = '\0';
    ski_str[3] = '\0';
    ski_str[4] = '\0';
    ski_str[5] = '\0';
    ski_str[6] = '\0';
    ski_str[7] = '\0';
    ski_str[8] = '\0';
    ski_str[9] = '\0';
    ski_str[10] = '\0';
    ski_str[0xb] = '\0';
    ski_str[0xc] = '\0';
    ski_str[0xd] = '\0';
    ski_str[0xe] = '\0';
    ski_str[0xf] = '\0';
    ski_to_char(ski_str,record->ski);
    lrtr_dbg("BGPSEC: WARNING: Invalid public key for SKI: %s",ski_str);
    iVar2 = -1;
    key = pub_key;
  }
  EC_KEY_free((EC_KEY *)key);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return iVar2;
}

Assistant:

int validate_signature(const unsigned char *hash, const struct rtr_signature_seg *sig, struct spki_record *record)
{
	int status = 0;
	enum rtr_bgpsec_rtvals retval;

	EC_KEY *pub_key = NULL;

	/* Load the contents of the spki buffer into the
	 * OpenSSL public key.
	 */
	retval = load_public_key(&pub_key, record->spki);

	if (retval != RTR_BGPSEC_SUCCESS) {
		/*The output string looks like this: "XX XX XX XX"*/
		/*where XX is a single byte. Including the spaces,*/
		/*we need to multiply by 3. The plus 1 is for the string*/
		/*terminator.*/
		char ski_str[(SKI_SIZE * 3) + 1] = {'\0'};

		ski_to_char(ski_str, record->ski);
		BGPSEC_DBG("WARNING: Invalid public key for SKI: %s", ski_str);
		retval = RTR_BGPSEC_ERROR;
		goto err;
	}

	/* The OpenSSL validation function to validate the signature. */
	status = ECDSA_verify(0, hash, SHA256_DIGEST_LENGTH, sig->signature, sig->sig_len, pub_key);

	switch (status) {
	case -1:
		BGPSEC_DBG1("ERROR: Failed to verify EC Signature");
		retval = RTR_BGPSEC_ERROR;
		break;
	case 0:
		BGPSEC_DBG1("Validation result of signature: invalid");
		retval = RTR_BGPSEC_NOT_VALID;
		break;
	case 1:
		BGPSEC_DBG1("Validation result of signature: valid");
		retval = RTR_BGPSEC_VALID;
		break;
	}

err:
	EC_KEY_free(pub_key);

	return retval;
}